

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_any.hpp
# Opt level: O3

int __thiscall
iutest::any::
holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::clone
          (holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  pointer pcVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x28);
  *puVar2 = &PTR__holder_001b2f60;
  puVar2[1] = puVar2 + 3;
  pcVar1 = (this->held)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 1),pcVar1,pcVar1 + (this->held)._M_string_length);
  return (int)puVar2;
}

Assistant:

virtual placeholder* clone() const IUTEST_CXX_OVERRIDE
        {
            return new holder<T>(held);
        }